

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O2

string * __thiscall
directed_flag_complex_cell_t::to_string_abi_cxx11_
          (string *__return_storage_ptr__,directed_flag_complex_cell_t *this,unsigned_short dim)

{
  uint uVar1;
  ushort uVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar2 = 0; uVar2 <= dim; uVar2 = uVar2 + 1) {
    uVar1 = (**this->_vptr_directed_flag_complex_cell_t)(this,(ulong)uVar2);
    std::__cxx11::to_string(&local_50,uVar1 & 0xffff);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    if (uVar2 < dim) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string to_string(
#ifdef USE_CELLS_WITHOUT_DIMENSION
	    unsigned short dim
#endif
	) const {
		const directed_flag_complex_cell_t* t = this;
#ifndef USE_CELLS_WITHOUT_DIMENSION
		unsigned short dim = dimension();
#endif
		std::string s;
		for (unsigned short index = 0; index < dim + 1; index++) {
			s += std::to_string(t->vertex(index));
			if (index < dim) s += "|";
		}
		return s;
	}